

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3423::EvaluateSectionFrame
          (ChElementShellANCF_3423 *this,double u,double v,ChVector<double> *point,
          ChQuaternion<double> *rot)

{
  double x;
  ChMatrix33<double> msect;
  ChVector<double> MidsurfaceY;
  ChVector<double> MidsurfaceX;
  ShapeVector Ny;
  ShapeVector Nx;
  MatrixNx3 e_bar;
  ChMatrix33<double> local_258;
  ChVector<double> local_210;
  ChVector<double> local_1f8;
  ChQuaternion<double> local_1e0;
  ShapeVector local_1c0;
  ShapeVector local_180;
  ChMatrixNM<double,_8,_3> local_140;
  
  x = u;
  (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
    [0x18])();
  CalcCoordMatrix(this,&local_140);
  ShapeFunctionsDerivativeX(this,&local_180,x,v,0.0);
  ShapeFunctionsDerivativeY(this,&local_1c0,u,v,0.0);
  local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_140;
  local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_180;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            (&local_1f8,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)&local_258,(type *)0x0);
  local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_140;
  local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_1c0;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            (&local_210,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)&local_258,(type *)0x0);
  ChMatrix33<double>::Set_A_Xdir(&local_258,&local_1f8,&local_210);
  ChMatrix33<double>::Get_A_quaternion(&local_1e0,&local_258);
  ChQuaternion<double>::operator=(rot,&local_1e0);
  return;
}

Assistant:

void ChElementShellANCF_3423::EvaluateSectionFrame(const double u,
                                                   const double v,
                                                   ChVector<>& point,
                                                   ChQuaternion<>& rot) {
    // this is not a corotational element, so just do:
    EvaluateSectionPoint(u, v, point);

    MatrixNx3 e_bar;
    CalcCoordMatrix(e_bar);

    ShapeVector Nx;
    ShapeVector Ny;
    ShapeFunctionsDerivativeX(Nx, u, v, 0);
    ShapeFunctionsDerivativeY(Ny, u, v, 0);

    // Since ANCF does not use rotations, calculate an approximate
    // rotation based off the position vector gradients
    ChVector<double> MidsurfaceX = e_bar.transpose() * Nx.transpose();
    ChVector<double> MidsurfaceY = e_bar.transpose() * Ny.transpose();

    // Since the position vector gradients are not in general orthogonal,
    // set the Dx direction tangent to the shell xi axis and
    // compute the Dy and Dz directions by using a
    // Gram-Schmidt orthonormalization, guided by the shell eta axis
    ChMatrix33<> msect;
    msect.Set_A_Xdir(MidsurfaceX, MidsurfaceY);

    rot = msect.Get_A_quaternion();
}